

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadController(ColladaParser *this,Controller *pController)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  Assimp *this_00;
  size_type *psVar7;
  size_type *__s;
  uint a;
  string *psVar8;
  long lVar9;
  string local_70;
  size_type *local_50;
  string *local_48;
  size_type *local_40;
  string *local_38;
  
  pController->mType = Skin;
  pController->mMethod = Normalized;
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar2 != '\0') {
    local_48 = &pController->mMorphWeight;
    local_50 = &(pController->mMorphWeight)._M_string_length;
    local_38 = &pController->mMorphTarget;
    __s = &(pController->mMorphTarget)._M_string_length;
    local_40 = __s;
    do {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) {
        if (iVar3 != 1) {
LAB_0043537a:
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"morph");
        if (iVar2 == 0) {
          pController->mType = Morph;
          GetAttribute(this,"source");
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])();
          __s = (size_type *)(CONCAT44(extraout_var_09,iVar2) + 1);
          pcVar1 = (char *)(pController->mMeshId)._M_string_length;
          strlen((char *)__s);
          std::__cxx11::string::_M_replace((ulong)&pController->mMeshId,0,pcVar1,(ulong)__s);
          uVar4 = GetAttribute(this,"method");
          if (0 < (int)uVar4) {
            __s = (size_type *)this->mReader->_vptr_IIrrXMLReader;
            iVar2 = (*(code *)__s[6])(this->mReader,(ulong)uVar4);
            iVar2 = strcmp((char *)CONCAT44(extraout_var_10,iVar2),"RELATIVE");
            if (iVar2 == 0) {
              pController->mMethod = Relative;
            }
          }
        }
        else {
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) goto LAB_0043537a;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"skin");
          if (iVar2 == 0) {
            GetAttribute(this,"source");
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])();
            __s = (size_type *)(CONCAT44(extraout_var_15,iVar2) + 1);
            pcVar1 = (char *)(pController->mMeshId)._M_string_length;
            strlen((char *)__s);
            std::__cxx11::string::_M_replace((ulong)&pController->mMeshId,0,pcVar1,(ulong)__s);
          }
          else {
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar2 != 1) goto LAB_0043537a;
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar2 = strcmp((char *)CONCAT44(extraout_var_01,iVar2),"bind_shape_matrix");
            if (iVar2 == 0) {
              this_00 = (Assimp *)GetTextContent(this);
              lVar9 = 0;
              do {
                this_00 = (Assimp *)
                          fast_atoreal_move<float>
                                    (this_00,(char *)(pController->mBindShapeMatrix + lVar9),
                                     (float *)0x1,SUB81(__s,0));
                while ((__s = (size_type *)(ulong)(byte)*this_00, __s < (size_type *)0x21 &&
                       ((0x100002600U >> ((ulong)__s & 0x3f) & 1) != 0))) {
                  this_00 = this_00 + 1;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 != 0x10);
              TestClosing(this,"bind_shape_matrix");
            }
            else {
              iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar2 != 1) goto LAB_0043537a;
              iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar2 = strcmp((char *)CONCAT44(extraout_var_02,iVar2),"source");
              if (iVar2 == 0) {
                ReadSource(this);
              }
              else {
                iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                if (iVar2 != 1) goto LAB_0043537a;
                iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar2 = strcmp((char *)CONCAT44(extraout_var_03,iVar2),"joints");
                if (iVar2 == 0) {
                  ReadControllerJoints(this,pController);
                }
                else {
                  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                  if (iVar2 != 1) goto LAB_0043537a;
                  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                  iVar2 = strcmp((char *)CONCAT44(extraout_var_04,iVar2),"vertex_weights");
                  if (iVar2 == 0) {
                    ReadControllerWeights(this,pController);
                  }
                  else {
                    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                    if (iVar2 != 1) goto LAB_0043537a;
                    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                    iVar2 = strcmp((char *)CONCAT44(extraout_var_05,iVar2),"targets");
                    if (iVar2 == 0) {
                      do {
                        while( true ) {
                          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
                          if ((char)iVar2 == '\0') goto LAB_00435359;
                          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                          if (iVar2 != 1) break;
                          if (iVar3 != 1) goto LAB_0043537a;
                          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                          iVar2 = strcmp((char *)CONCAT44(extraout_var_11,iVar2),"input");
                          if (iVar2 == 0) {
                            uVar4 = GetAttribute(this,"semantic");
                            uVar5 = GetAttribute(this,"source");
                            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                              (this->mReader,(ulong)uVar4);
                            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                              (this->mReader,(ulong)uVar5);
                            iVar6 = strcmp((char *)CONCAT44(extraout_var_12,iVar2),"MORPH_TARGET");
                            psVar7 = local_40;
                            psVar8 = local_38;
                            if ((iVar6 == 0) ||
                               (iVar2 = strcmp((char *)CONCAT44(extraout_var_12,iVar2),
                                               "MORPH_WEIGHT"), __s = local_50, psVar7 = local_50,
                               psVar8 = local_48, iVar2 == 0)) {
                              __s = (size_type *)(CONCAT44(extraout_var_13,iVar3) + 1);
                              pcVar1 = (char *)*psVar7;
                              strlen((char *)__s);
                              std::__cxx11::string::_M_replace((ulong)psVar8,0,pcVar1,(ulong)__s);
                            }
                          }
                        }
                      } while (iVar3 != 2);
                      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                      iVar2 = strcmp((char *)CONCAT44(extraout_var_14,iVar2),"targets");
                      if (iVar2 != 0) {
                        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_70,"Expected end of <targets> element.","");
                        ThrowException(this,&local_70);
                      }
                    }
                    else {
                      SkipElement(this);
                    }
                  }
                }
              }
            }
          }
        }
      }
      else if (iVar3 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_06,iVar2),"controller");
        if (iVar2 == 0) {
          return;
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_07,iVar2),"skin");
        if (iVar2 != 0) {
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar2 = strcmp((char *)CONCAT44(extraout_var_08,iVar2),"morph");
          if (iVar2 != 0) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,"Expected end of <controller> element.","");
            ThrowException(this,&local_70);
          }
        }
      }
LAB_00435359:
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar2 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadController(Collada::Controller& pController)
{
    // initial values
    pController.mType = Skin;
    pController.mMethod = Normalized;
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // two types of controllers: "skin" and "morph". Only the first one is relevant, we skip the other
            if (IsElement("morph"))
            {
                pController.mType = Morph;
                int baseIndex = GetAttribute("source");
                pController.mMeshId = mReader->getAttributeValue(baseIndex) + 1;
                int methodIndex = GetAttribute("method");
                if (methodIndex > 0) {
                    const char *method = mReader->getAttributeValue(methodIndex);
                    if (strcmp(method, "RELATIVE") == 0)
                        pController.mMethod = Relative;
                }
            }
            else if (IsElement("skin"))
            {
                // read the mesh it refers to. According to the spec this could also be another
                // controller, but I refuse to implement every single idea they've come up with
                int sourceIndex = GetAttribute("source");
                pController.mMeshId = mReader->getAttributeValue(sourceIndex) + 1;
            }
            else if (IsElement("bind_shape_matrix"))
            {
                // content is 16 floats to define a matrix... it seems to be important for some models
                const char* content = GetTextContent();

                // read the 16 floats
                for (unsigned int a = 0; a < 16; a++)
                {
                    // read a number
                    content = fast_atoreal_move<ai_real>(content, pController.mBindShapeMatrix[a]);
                    // skip whitespace after it
                    SkipSpacesAndLineEnd(&content);
                }

                TestClosing("bind_shape_matrix");
            }
            else if (IsElement("source"))
            {
                // data array - we have specialists to handle this
                ReadSource();
            }
            else if (IsElement("joints"))
            {
                ReadControllerJoints(pController);
            }
            else if (IsElement("vertex_weights"))
            {
                ReadControllerWeights(pController);
            }
            else if (IsElement("targets"))
            {
                while (mReader->read()) {
                    if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
                        if (IsElement("input")) {
                            int semanticsIndex = GetAttribute("semantic");
                            int sourceIndex = GetAttribute("source");

                            const char *semantics = mReader->getAttributeValue(semanticsIndex);
                            const char *source = mReader->getAttributeValue(sourceIndex);
                            if (strcmp(semantics, "MORPH_TARGET") == 0) {
                                pController.mMorphTarget = source + 1;
                            }
                            else if (strcmp(semantics, "MORPH_WEIGHT") == 0)
                            {
                                pController.mMorphWeight = source + 1;
                            }
                        }
                    }
                    else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
                        if (strcmp(mReader->getNodeName(), "targets") == 0)
                            break;
                        else
                            ThrowException("Expected end of <targets> element.");
                    }
                }
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "controller") == 0)
                break;
            else if (strcmp(mReader->getNodeName(), "skin") != 0 && strcmp(mReader->getNodeName(), "morph") != 0)
                ThrowException("Expected end of <controller> element.");
        }
    }
}